

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall spirv_cross::CompilerGLSL::compile_abi_cxx11_(CompilerGLSL *this)

{
  bool bVar1;
  ExecutionModel model;
  uint32_t id;
  SPIRFunction *func;
  SPIREntryPoint *pSVar2;
  CompilerGLSL *in_RSI;
  bool local_94;
  bool local_93;
  byte local_92;
  byte local_91;
  Bitset local_68;
  uint32_t local_1c;
  uint32_t pass_count;
  CompilerGLSL *this_local;
  
  this_local = this;
  ParsedIR::fixup_reserved_names(&(in_RSI->super_Compiler).ir);
  if (((in_RSI->options).vulkan_semantics & 1U) == 0) {
    (in_RSI->backend).nonuniform_qualifier = "";
    (in_RSI->backend).needs_row_major_load_workaround =
         (bool)((in_RSI->options).enable_row_major_load_workaround & 1);
  }
  local_91 = 1;
  if (((in_RSI->options).vulkan_semantics & 1U) == 0) {
    local_91 = (in_RSI->options).es;
  }
  (in_RSI->backend).allow_precision_qualifiers = (bool)(local_91 & 1);
  (in_RSI->backend).force_gl_in_out_block = true;
  (in_RSI->backend).supports_extensions = true;
  (in_RSI->backend).use_array_constructor = true;
  (in_RSI->backend).workgroup_size_is_hidden = true;
  local_92 = 1;
  if (((in_RSI->options).es & 1U) == 0) {
    local_92 = (in_RSI->options).vulkan_semantics;
  }
  (in_RSI->backend).requires_relaxed_precision_analysis = (bool)(local_92 & 1);
  if ((((in_RSI->options).es & 1U) != 0) || (local_93 = true, (in_RSI->options).version < 400)) {
    local_94 = false;
    if (((in_RSI->options).es & 1U) != 0) {
      local_94 = 0x13f < (in_RSI->options).version;
    }
    local_93 = local_94;
  }
  (in_RSI->backend).support_precise_qualifier = local_93;
  bVar1 = is_legacy_es(in_RSI);
  if (bVar1) {
    (in_RSI->backend).support_case_fallthrough = false;
  }
  fixup_anonymous_struct_names(in_RSI);
  fixup_type_alias(in_RSI);
  reorder_type_alias(in_RSI);
  Compiler::build_function_control_flow_graphs_and_analyze(&in_RSI->super_Compiler);
  find_static_extensions(in_RSI);
  fixup_image_load_store_access(in_RSI);
  Compiler::update_active_builtins(&in_RSI->super_Compiler);
  Compiler::analyze_image_and_sampler_usage(&in_RSI->super_Compiler);
  Compiler::analyze_interlocked_resource_usage(&in_RSI->super_Compiler);
  bVar1 = ::std::
          vector<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>::
          empty(&in_RSI->inout_color_attachments);
  if (!bVar1) {
    emit_inout_fragment_outputs_copy_to_subpass_inputs(in_RSI);
  }
  if ((in_RSI->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    Compiler::analyze_non_block_pointer_types(&in_RSI->super_Compiler);
  }
  local_1c = 0;
  do {
    reset(in_RSI,local_1c);
    StringStream<4096UL,_4096UL>::reset(&in_RSI->buffer);
    (*(in_RSI->super_Compiler)._vptr_Compiler[0xe])();
    emit_resources(in_RSI);
    model = Compiler::get_execution_model(&in_RSI->super_Compiler);
    emit_extension_workarounds(in_RSI,model);
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&(in_RSI->super_Compiler).ir.default_entry_point);
    func = Compiler::get<spirv_cross::SPIRFunction>(&in_RSI->super_Compiler,id);
    local_68.higher._M_h._M_rehash_policy._M_next_resize = 0;
    local_68.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_68.higher._M_h._M_element_count = 0;
    local_68.higher._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_68.higher._M_h._M_rehash_policy._4_4_ = 0;
    local_68.higher._M_h._M_bucket_count = 0;
    local_68.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68.lower = 0;
    local_68.higher._M_h._M_buckets = (__buckets_ptr)0x0;
    Bitset::Bitset(&local_68);
    emit_function(in_RSI,func,&local_68);
    Bitset::~Bitset(&local_68);
    local_1c = local_1c + 1;
    bVar1 = Compiler::is_forcing_recompilation(&in_RSI->super_Compiler);
  } while (bVar1);
  if (((in_RSI->super_Compiler).interlocked_is_complex & 1U) != 0) {
    statement<char_const(&)[12]>(in_RSI,(char (*) [12])"void main()");
    begin_scope(in_RSI);
    statement<char_const(&)[78]>
              (in_RSI,(char (*) [78])
                      "// Interlocks were used in a way not compatible with GLSL, this is very slow."
              );
    statement<char_const(&)[40]>(in_RSI,(char (*) [40])"SPIRV_Cross_beginInvocationInterlock();");
    statement<char_const(&)[26]>(in_RSI,(char (*) [26])"spvMainInterlockedBody();");
    statement<char_const(&)[38]>(in_RSI,(char (*) [38])"SPIRV_Cross_endInvocationInterlock();");
    end_scope(in_RSI);
  }
  pSVar2 = Compiler::get_entry_point(&in_RSI->super_Compiler);
  ::std::__cxx11::string::operator=((string *)&pSVar2->name,"main");
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  return this;
}

Assistant:

string CompilerGLSL::compile()
{
	ir.fixup_reserved_names();

	if (!options.vulkan_semantics)
	{
		// only NV_gpu_shader5 supports divergent indexing on OpenGL, and it does so without extra qualifiers
		backend.nonuniform_qualifier = "";
		backend.needs_row_major_load_workaround = options.enable_row_major_load_workaround;
	}
	backend.allow_precision_qualifiers = options.vulkan_semantics || options.es;
	backend.force_gl_in_out_block = true;
	backend.supports_extensions = true;
	backend.use_array_constructor = true;
	backend.workgroup_size_is_hidden = true;
	backend.requires_relaxed_precision_analysis = options.es || options.vulkan_semantics;
	backend.support_precise_qualifier =
			(!options.es && options.version >= 400) || (options.es && options.version >= 320);

	if (is_legacy_es())
		backend.support_case_fallthrough = false;

	// Scan the SPIR-V to find trivial uses of extensions.
	fixup_anonymous_struct_names();
	fixup_type_alias();
	reorder_type_alias();
	build_function_control_flow_graphs_and_analyze();
	find_static_extensions();
	fixup_image_load_store_access();
	update_active_builtins();
	analyze_image_and_sampler_usage();
	analyze_interlocked_resource_usage();
	if (!inout_color_attachments.empty())
		emit_inout_fragment_outputs_copy_to_subpass_inputs();

	// Shaders might cast unrelated data to pointers of non-block types.
	// Find all such instances and make sure we can cast the pointers to a synthesized block type.
	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
		analyze_non_block_pointer_types();

	uint32_t pass_count = 0;
	do
	{
		reset(pass_count);

		buffer.reset();

		emit_header();
		emit_resources();
		emit_extension_workarounds(get_execution_model());

		emit_function(get<SPIRFunction>(ir.default_entry_point), Bitset());

		pass_count++;
	} while (is_forcing_recompilation());

	// Implement the interlocked wrapper function at the end.
	// The body was implemented in lieu of main().
	if (interlocked_is_complex)
	{
		statement("void main()");
		begin_scope();
		statement("// Interlocks were used in a way not compatible with GLSL, this is very slow.");
		statement("SPIRV_Cross_beginInvocationInterlock();");
		statement("spvMainInterlockedBody();");
		statement("SPIRV_Cross_endInvocationInterlock();");
		end_scope();
	}

	// Entry point in GLSL is always main().
	get_entry_point().name = "main";

	return buffer.str();
}